

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

SampleAnalysis *
Catch::Benchmark::Detail::analyse
          (SampleAnalysis *__return_storage_ptr__,IConfig *cfg,FDuration *first,FDuration *last)

{
  pointer pdVar1;
  int iVar2;
  uint n_resamples;
  size_type __n;
  pointer pdVar3;
  FDuration *it;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  vector<double,_std::allocator<double>_> samples_1;
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  samples2;
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  samples;
  OutlierClassification outliers;
  double local_e0;
  _Vector_base<double,_std::allocator<double>_> local_d8;
  duration<double,_std::ratio<1L,_1000000000L>_> local_c0;
  _Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  local_b8;
  bootstrap_analysis local_98;
  OutlierClassification local_44;
  
  iVar2 = (*cfg->_vptr_IConfig[0x18])(cfg);
  __n = (long)last - (long)first >> 3;
  if ((char)iVar2 == '\0') {
    local_d8._M_impl.super__Vector_impl_data._M_start = (double *)0x0;
    local_d8._M_impl.super__Vector_impl_data._M_finish = (double *)0x0;
    local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::reserve
              ((vector<double,_std::allocator<double>_> *)&local_d8,__n);
    for (; first != last; first = first + 1) {
      local_98.mean.point = first->__r;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                ((vector<double,_std::allocator<double>_> *)&local_d8,(double *)&local_98);
    }
    (*cfg->_vptr_IConfig[0x1a])(cfg);
    n_resamples = (*cfg->_vptr_IConfig[0x1b])(cfg);
    analyse_samples(&local_98,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),n_resamples,
                    local_d8._M_impl.super__Vector_impl_data._M_start,
                    local_d8._M_impl.super__Vector_impl_data._M_finish);
    classify_outliers(&local_44,local_d8._M_impl.super__Vector_impl_data._M_start,
                      local_d8._M_impl.super__Vector_impl_data._M_finish);
    local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ::reserve((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
               *)&local_b8,
              (long)local_d8._M_impl.super__Vector_impl_data._M_finish -
              (long)local_d8._M_impl.super__Vector_impl_data._M_start >> 3);
    pdVar1 = local_d8._M_impl.super__Vector_impl_data._M_finish;
    for (pdVar3 = local_d8._M_impl.super__Vector_impl_data._M_start; pdVar3 != pdVar1;
        pdVar3 = pdVar3 + 1) {
      local_c0.__r = *pdVar3;
      std::
      vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>
      ::emplace_back<std::chrono::duration<double,std::ratio<1l,1000000000l>>>
                ((vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>
                  *)&local_b8,&local_c0);
    }
    (__return_storage_ptr__->samples).
    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_b8._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->samples).
    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = local_b8._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->samples).
    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_b8._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->mean).point.__r = local_98.mean.point;
    (__return_storage_ptr__->mean).lower_bound.__r = local_98.mean.lower_bound;
    (__return_storage_ptr__->mean).upper_bound.__r = local_98.mean.upper_bound;
    (__return_storage_ptr__->mean).confidence_interval = local_98.mean.confidence_interval;
    (__return_storage_ptr__->standard_deviation).point.__r = local_98.standard_deviation.point;
    (__return_storage_ptr__->standard_deviation).lower_bound.__r =
         local_98.standard_deviation.lower_bound;
    (__return_storage_ptr__->standard_deviation).upper_bound.__r =
         local_98.standard_deviation.upper_bound;
    (__return_storage_ptr__->standard_deviation).confidence_interval =
         local_98.standard_deviation.confidence_interval;
    (__return_storage_ptr__->outliers).samples_seen = local_44.samples_seen;
    (__return_storage_ptr__->outliers).low_severe = local_44.low_severe;
    (__return_storage_ptr__->outliers).low_mild = local_44.low_mild;
    (__return_storage_ptr__->outliers).high_mild = local_44.high_mild;
    (__return_storage_ptr__->outliers).high_severe = local_44.high_severe;
    __return_storage_ptr__->outlier_variance = local_98.outlier_variance;
    std::
    _Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ::~_Vector_base(&local_b8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_d8);
  }
  else {
    local_98.mean.point = 0.0;
    local_98.mean.lower_bound = 0.0;
    local_98.mean.upper_bound = 0.0;
    std::
    vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ::reserve((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
               *)&local_98,__n);
    iVar2 = 0;
    local_e0 = 0.0;
    for (; first < last; first = first + 1) {
      std::
      vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
      ::push_back((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                   *)&local_98,first);
      local_e0 = local_e0 + first->__r;
      iVar2 = iVar2 + 1;
    }
    local_e0 = local_e0 / (double)iVar2;
    (__return_storage_ptr__->samples).
    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_98.mean.point;
    (__return_storage_ptr__->samples).
    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_98.mean.lower_bound;
    (__return_storage_ptr__->samples).
    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_98.mean.upper_bound;
    local_98.mean.upper_bound = 0.0;
    local_98.mean.point = 0.0;
    local_98.mean.lower_bound = 0.0;
    (__return_storage_ptr__->mean).point.__r = local_e0;
    (__return_storage_ptr__->mean).lower_bound.__r = local_e0;
    (__return_storage_ptr__->mean).upper_bound.__r = local_e0;
    __return_storage_ptr__->outlier_variance = 0.0;
    (__return_storage_ptr__->mean).confidence_interval = 0.0;
    (__return_storage_ptr__->standard_deviation).point.__r = 0.0;
    (__return_storage_ptr__->standard_deviation).lower_bound.__r = 0.0;
    (__return_storage_ptr__->standard_deviation).upper_bound.__r = 0.0;
    (__return_storage_ptr__->standard_deviation).confidence_interval = 0.0;
    (__return_storage_ptr__->outliers).samples_seen = 0;
    (__return_storage_ptr__->outliers).low_severe = 0;
    (__return_storage_ptr__->outliers).low_severe = 0;
    (__return_storage_ptr__->outliers).low_mild = 0;
    (__return_storage_ptr__->outliers).high_mild = 0;
    (__return_storage_ptr__->outliers).high_severe = 0;
    std::
    _Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ::~_Vector_base((_Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                     *)&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

SampleAnalysis analyse(const IConfig &cfg, FDuration* first, FDuration* last) {
                if (!cfg.benchmarkNoAnalysis()) {
                    std::vector<double> samples;
                    samples.reserve(static_cast<size_t>(last - first));
                    for (auto current = first; current != last; ++current) {
                        samples.push_back( current->count() );
                    }

                    auto analysis = Catch::Benchmark::Detail::analyse_samples(
                        cfg.benchmarkConfidenceInterval(),
                        cfg.benchmarkResamples(),
                        samples.data(),
                        samples.data() + samples.size() );
                    auto outliers = Catch::Benchmark::Detail::classify_outliers(
                        samples.data(), samples.data() + samples.size() );

                    auto wrap_estimate = [](Estimate<double> e) {
                        return Estimate<FDuration> {
                            FDuration(e.point),
                                FDuration(e.lower_bound),
                                FDuration(e.upper_bound),
                                e.confidence_interval,
                        };
                    };
                    std::vector<FDuration> samples2;
                    samples2.reserve(samples.size());
                    for (auto s : samples) {
                        samples2.push_back( FDuration( s ) );
                    }

                    return {
                        CATCH_MOVE(samples2),
                        wrap_estimate(analysis.mean),
                        wrap_estimate(analysis.standard_deviation),
                        outliers,
                        analysis.outlier_variance,
                    };
                } else {
                    std::vector<FDuration> samples;
                    samples.reserve(static_cast<size_t>(last - first));

                    FDuration mean = FDuration(0);
                    int i = 0;
                    for (auto it = first; it < last; ++it, ++i) {
                        samples.push_back(*it);
                        mean += *it;
                    }
                    mean /= i;

                    return SampleAnalysis{
                        CATCH_MOVE(samples),
                        Estimate<FDuration>{ mean, mean, mean, 0.0 },
                        Estimate<FDuration>{ FDuration( 0 ),
                                             FDuration( 0 ),
                                             FDuration( 0 ),
                                             0.0 },
                        OutlierClassification{},
                        0.0
                    };
                }
            }